

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_cHRM(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  undefined1 local_68 [8];
  png_xy xy;
  png_byte buf [32];
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  if ((png_ptr->mode & 1) != 0) {
    if ((png_ptr->mode & 6) == 0) {
      if (length == 0x20) {
        png_crc_read(png_ptr,(png_bytep)&xy.whitex,0x20);
        iVar1 = png_crc_finish(png_ptr,0);
        if (iVar1 == 0) {
          xy.bluex = png_get_fixed_point((png_structrp)0x0,(png_const_bytep)&xy.whitex);
          xy.bluey = png_get_fixed_point((png_structrp)0x0,(png_const_bytep)&xy.whitey);
          local_68._0_4_ = png_get_fixed_point((png_structrp)0x0,buf);
          local_68._4_4_ = png_get_fixed_point((png_structrp)0x0,buf + 4);
          xy.redx = png_get_fixed_point((png_structrp)0x0,buf + 8);
          xy.redy = png_get_fixed_point((png_structrp)0x0,buf + 0xc);
          xy.greenx = png_get_fixed_point((png_structrp)0x0,buf + 0x10);
          xy.greeny = png_get_fixed_point((png_structrp)0x0,buf + 0x14);
          if (((((xy.bluex == -1) || (xy.bluey == -1)) || (local_68._0_4_ == -1)) ||
              ((local_68._4_4_ == -1 || (xy.redx == -1)))) ||
             ((xy.redy == -1 || ((xy.greenx == -1 || (xy.greeny == -1)))))) {
            png_chunk_benign_error(png_ptr,"invalid values");
          }
          else if (((png_ptr->colorspace).flags & 0x8000) == 0) {
            if (((png_ptr->colorspace).flags & 0x10) == 0) {
              (png_ptr->colorspace).flags = (png_ptr->colorspace).flags | 0x10;
              png_colorspace_set_chromaticities(png_ptr,&png_ptr->colorspace,(png_xy *)local_68,1);
              png_colorspace_sync(png_ptr,info_ptr);
            }
            else {
              (png_ptr->colorspace).flags = (png_ptr->colorspace).flags | 0x8000;
              png_colorspace_sync(png_ptr,info_ptr);
              png_chunk_benign_error(png_ptr,"duplicate");
            }
          }
        }
      }
      else {
        png_crc_finish(png_ptr,length);
        png_chunk_benign_error(png_ptr,"invalid");
      }
    }
    else {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"out of place");
    }
    return;
  }
  png_chunk_error(png_ptr,"missing IHDR");
}

Assistant:

void /* PRIVATE */
png_handle_cHRM(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte buf[32];
   png_xy xy;

   png_debug(1, "in png_handle_cHRM");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & (PNG_HAVE_IDAT|PNG_HAVE_PLTE)) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   if (length != 32)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, buf, 32);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   xy.whitex = png_get_fixed_point(NULL, buf);
   xy.whitey = png_get_fixed_point(NULL, buf + 4);
   xy.redx   = png_get_fixed_point(NULL, buf + 8);
   xy.redy   = png_get_fixed_point(NULL, buf + 12);
   xy.greenx = png_get_fixed_point(NULL, buf + 16);
   xy.greeny = png_get_fixed_point(NULL, buf + 20);
   xy.bluex  = png_get_fixed_point(NULL, buf + 24);
   xy.bluey  = png_get_fixed_point(NULL, buf + 28);

   if (xy.whitex == PNG_FIXED_ERROR ||
       xy.whitey == PNG_FIXED_ERROR ||
       xy.redx   == PNG_FIXED_ERROR ||
       xy.redy   == PNG_FIXED_ERROR ||
       xy.greenx == PNG_FIXED_ERROR ||
       xy.greeny == PNG_FIXED_ERROR ||
       xy.bluex  == PNG_FIXED_ERROR ||
       xy.bluey  == PNG_FIXED_ERROR)
   {
      png_chunk_benign_error(png_ptr, "invalid values");
      return;
   }

   /* If a colorspace error has already been output skip this chunk */
   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_INVALID) != 0)
      return;

   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_FROM_cHRM) != 0)
   {
      png_ptr->colorspace.flags |= PNG_COLORSPACE_INVALID;
      png_colorspace_sync(png_ptr, info_ptr);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   png_ptr->colorspace.flags |= PNG_COLORSPACE_FROM_cHRM;
   (void)png_colorspace_set_chromaticities(png_ptr, &png_ptr->colorspace, &xy,
       1/*prefer cHRM values*/);
   png_colorspace_sync(png_ptr, info_ptr);
}